

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::iterate
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  GLenum GVar1;
  code *pcVar2;
  undefined1 auVar3 [16];
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  NotSupportedError *this_00;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  size_type sVar9;
  reference pvVar10;
  ulong uVar11;
  TestLog *pTVar12;
  MessageBuilder *pMVar13;
  TestError *pTVar14;
  undefined1 *puVar15;
  undefined4 uVar16;
  undefined1 local_474 [4];
  undefined1 local_470 [4];
  uchar expectedData [4];
  uint local_2ec;
  uint local_2e8;
  GLenum _fboCompleteness;
  uint nLayer;
  uint nTexture_1;
  uint nTexture;
  uint min_depth;
  uint local_154;
  uint local_150;
  GLenum fboCompleteness;
  uint i_2;
  uint i_1;
  GLenum *drawBuffers;
  undefined1 local_138 [4];
  uint i;
  uchar buffer [256];
  Functions *gl;
  GeometryShaderLayeredRenderingBoundaryCondition *this_local;
  long lVar8;
  
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x138);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar7->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar8 + 0x78))(0x8ca9);
  memset(local_138,0,0x100);
  for (drawBuffers._4_4_ = 0; uVar11 = (ulong)drawBuffers._4_4_,
      sVar9 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::size(&this->m_textures_info), uVar11 < sVar9;
      drawBuffers._4_4_ = drawBuffers._4_4_ + 1) {
    pcVar2 = *(code **)(lVar8 + 0xb8);
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)drawBuffers._4_4_);
    GVar1 = pvVar10->m_texture_target;
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)drawBuffers._4_4_);
    (*pcVar2)(GVar1,pvVar10->m_id);
    pcVar2 = *(code **)(lVar8 + 0x1398);
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)drawBuffers._4_4_);
    GVar1 = pvVar10->m_texture_target;
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)drawBuffers._4_4_);
    (*pcVar2)(GVar1,1,0x8058,4,4,pvVar10->m_depth);
    pcVar2 = *(code **)(lVar8 + 0x13c0);
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)drawBuffers._4_4_);
    GVar1 = pvVar10->m_texture_target;
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)drawBuffers._4_4_);
    (*pcVar2)(GVar1,0,0,0,0,4,4,pvVar10->m_depth,0x1908,0x1401,local_138);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"Error configuring a texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                    ,0x14f);
  }
  sVar9 = std::
          vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
          ::size(&this->m_textures_info);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar9;
  uVar11 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  _i_2 = operator_new__(uVar11);
  for (fboCompleteness = 0; uVar11 = (ulong)fboCompleteness,
      sVar9 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::size(&this->m_textures_info), uVar11 < sVar9; fboCompleteness = fboCompleteness + 1)
  {
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,(ulong)fboCompleteness);
    *(GLenum *)((long)_i_2 + (ulong)fboCompleteness * 4) = pvVar10->m_draw_buffer;
  }
  pcVar2 = *(code **)(lVar8 + 0x560);
  sVar9 = std::
          vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
          ::size(&this->m_textures_info);
  (*pcVar2)(sVar9 & 0xffffffff,_i_2);
  if (_i_2 != (void *)0x0) {
    operator_delete__(_i_2);
  }
  _i_2 = (void *)0x0;
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Error setting draw buffers!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                  ,0x161);
  for (local_150 = 0; uVar11 = (ulong)local_150,
      sVar9 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::size(&this->m_textures_info), uVar11 < sVar9; local_150 = local_150 + 1) {
    if ((this->m_is_fbo_layered & 1U) == 0) {
      pcVar2 = *(code **)(lVar8 + 0x6b8);
      pvVar10 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::operator[](&this->m_textures_info,(ulong)local_150);
      GVar1 = pvVar10->m_draw_buffer;
      pvVar10 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::operator[](&this->m_textures_info,(ulong)local_150);
      (*pcVar2)(0x8ca9,GVar1,pvVar10->m_id,0,local_150);
    }
    else {
      pcVar2 = *(code **)(lVar8 + 0x690);
      pvVar10 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::operator[](&this->m_textures_info,(ulong)local_150);
      GVar1 = pvVar10->m_draw_buffer;
      pvVar10 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::operator[](&this->m_textures_info,(ulong)local_150);
      (*pcVar2)(0x8ca9,GVar1,pvVar10->m_id,0);
    }
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"Error configuring framebuffer objects!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                    ,0x171);
  }
  local_154 = (**(code **)(lVar8 + 0x170))(0x8ca9);
  if (local_154 != 0x8cd5) {
    pTVar12 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&nTexture,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&nTexture,(char (*) [25])"Draw FBO is incomplete: ");
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2c316fc);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_154);
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x29dc08e);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&nTexture);
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Draw FBO is incomplete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x17c);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar8 + 0x1a00))(0,0,4);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Error setting up viewport!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                  ,0x182);
  (**(code **)(lVar8 + 0xd8))(this->m_vao_id);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Error configuring vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                  ,0x187);
  (**(code **)(lVar8 + 0x1680))(this->m_po_id);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Error using program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                  ,0x18c);
  (**(code **)(lVar8 + 0x538))(this->m_draw_mode,0,this->m_n_points);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                  ,400);
  (**(code **)(lVar8 + 0x78))(0x8ca8);
  nTexture_1 = 0;
  sVar9 = std::
          vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
          ::size(&this->m_textures_info);
  if (sVar9 != 0) {
    pvVar10 = std::
              vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
              ::operator[](&this->m_textures_info,0);
    nTexture_1 = pvVar10->m_depth;
    for (nLayer = 1; uVar11 = (ulong)nLayer,
        sVar9 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::size(&this->m_textures_info), uVar6 = nTexture_1, uVar11 < sVar9;
        nLayer = nLayer + 1) {
      pvVar10 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::operator[](&this->m_textures_info,(ulong)nLayer);
      if ((uint)pvVar10->m_depth < uVar6) {
        pvVar10 = std::
                  vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                  ::operator[](&this->m_textures_info,(ulong)nLayer);
        nTexture_1 = pvVar10->m_depth;
      }
    }
  }
  _fboCompleteness = 0;
  do {
    uVar11 = (ulong)_fboCompleteness;
    sVar9 = std::
            vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
            ::size(&this->m_textures_info);
    if (sVar9 <= uVar11) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    for (local_2e8 = 0; local_2e8 < nTexture_1; local_2e8 = local_2e8 + 1) {
      pcVar2 = *(code **)(lVar8 + 0x6b8);
      pvVar10 = std::
                vector<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                ::operator[](&this->m_textures_info,(ulong)_fboCompleteness);
      (*pcVar2)(0x8ca8,0x8ce0,pvVar10->m_id,0,local_2e8);
      dVar5 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar5,"Could not set up read framebuffer!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x1ad);
      local_2ec = (**(code **)(lVar8 + 0x170))(0x8ca9);
      if (local_2ec != 0x8cd5) {
        pTVar12 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_470,pTVar12,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_470,(char (*) [25])"Read FBO is incomplete: ");
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x2c316fc);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_2ec);
        pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,(char (*) [2])0x29dc08e);
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_470);
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar14,"Read FBO is incomplete.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                   ,0x1b7);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar8 + 0x1a00))(0,0,4);
      puVar15 = local_138;
      (**(code **)(lVar8 + 0x1220))(0,0,4,4,0x1908,0x1401,puVar15);
      uVar16 = (undefined4)((ulong)puVar15 >> 0x20);
      dVar5 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar5,"Could not read pixels using glReadPixels()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x1bf);
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])
                (this,(ulong)local_2e8,local_474,4);
      uVar6 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
                        (this,4,4,4,local_138,local_474,CONCAT44(uVar16,_fboCompleteness),local_2e8)
      ;
      if ((uVar6 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        return STOP;
      }
    }
    _fboCompleteness = _fboCompleteness + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRenderingBoundaryCondition::iterate(void)
{
	/* check if EXT_geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);

	/* Set up all textures */
	unsigned char buffer[m_width * m_height * m_max_depth * m_texture_components];

	memset(buffer, 0, sizeof(buffer));

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.bindTexture(m_textures_info[i].m_texture_target, m_textures_info[i].m_id);
		gl.texStorage3D(m_textures_info[i].m_texture_target, 1, GL_RGBA8, m_width, m_height,
						m_textures_info[i].m_depth);
		gl.texSubImage3D(m_textures_info[i].m_texture_target, 0, 0, 0, 0, m_width, m_height, m_textures_info[i].m_depth,
						 GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring a texture object!");
	}

	/* Set up draw buffers */
	{
		glw::GLenum* drawBuffers = new glw::GLenum[m_textures_info.size()];

		for (unsigned int i = 0; i < m_textures_info.size(); i++)
		{
			drawBuffers[i] = m_textures_info[i].m_draw_buffer;
		}

		gl.drawBuffers((glw::GLsizei)m_textures_info.size(), drawBuffers);

		delete[] drawBuffers;
		drawBuffers = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting draw buffers!");

	/* Configure draw FBO so that it uses texture attachments */
	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		if (m_is_fbo_layered)
		{
			gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
								  0 /* level */);
		}
		else
		{
			gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
									   0 /* level */, i /* layer */);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring framebuffer objects!");
	} /* for (all textures considered) */

	/* Verify draw framebuffer is considered complete */
	glw::GLenum fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw FBO is incomplete: "
						   << "[" << fboCompleteness << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Draw FBO is incomplete.");
	}

	/* Set up viewport */
	gl.viewport(0, 0, m_width, m_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up viewport!");

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex array object!");

	/* Render */
	gl.useProgram(m_po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program object!");

	gl.drawArrays(m_draw_mode, 0, m_n_points);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Bind read framebuffer object. */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);

	/* Compare the rendered data against reference representation */
	unsigned int min_depth = 0;

	if (m_textures_info.size() > 0)
	{
		min_depth = m_textures_info[0].m_depth;

		for (unsigned int nTexture = 1; nTexture < m_textures_info.size(); nTexture++)
		{
			if (min_depth > (unsigned)m_textures_info[nTexture].m_depth)
			{
				min_depth = m_textures_info[nTexture].m_depth;
			}
		}
	}

	for (unsigned int nTexture = 0; nTexture < m_textures_info.size(); nTexture++)
	{
		for (unsigned int nLayer = 0; nLayer < min_depth; nLayer++)
		{
			/* Configure read FBO's color attachment */
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_textures_info[nTexture].m_id, 0,
									   nLayer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up read framebuffer!");

			/* Verify read framebuffer is considered complete */
			glw::GLenum _fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

			if (_fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Read FBO is incomplete: "
								   << "[" << _fboCompleteness << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL("Read FBO is incomplete.");
			}
			gl.viewport(0, 0, m_width, m_height);

			/* Read the rendered data */
			gl.readPixels(0 /* x */, 0 /* y */, m_width /* width */, m_height /* height */, GL_RGBA, GL_UNSIGNED_BYTE,
						  buffer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixels using glReadPixels()");

			/* Retrieve reference color for layer */
			unsigned char expectedData[m_texture_components];

			getReferenceColor(nLayer, expectedData, m_texture_components);

			/* Compare the retrieved data with reference data */
			if (!comparePixels(m_width, m_height, m_texture_components, buffer, expectedData, nTexture, nLayer))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			} /* if (data comparison failed) */
		}	 /* for (all layers) */
	}		  /* for (all texture objects) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}